

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printReturn(JSPrinter *this,Ref node)

{
  Ref *this_00;
  undefined8 *puVar1;
  char cVar2;
  Value *local_20;
  Ref node_local;
  
  local_20 = node.inst;
  emit(this,"return");
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&local_20);
  cVar2 = cashew::Ref::operator!(this_00);
  if (cVar2 == '\0') {
    emit(this,' ');
    puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
    print(this,(Value *)*puVar1);
  }
  return;
}

Assistant:

void printReturn(Ref node) {
    emit("return");
    if (!!node[1]) {
      emit(' ');
      print(node[1]);
    }
  }